

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

uint stbiw__crc32(uchar *buffer,int len)

{
  uint uVar1;
  int local_20;
  uint local_1c;
  int j;
  int i;
  uint crc;
  int len_local;
  uchar *buffer_local;
  
  j = -1;
  if (stbiw__crc32::crc_table[1] == 0) {
    for (local_1c = 0; (int)local_1c < 0x100; local_1c = local_1c + 1) {
      stbiw__crc32::crc_table[(int)local_1c] = local_1c;
      for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
        uVar1 = 0;
        if ((stbiw__crc32::crc_table[(int)local_1c] & 1) != 0) {
          uVar1 = 0xedb88320;
        }
        stbiw__crc32::crc_table[(int)local_1c] = stbiw__crc32::crc_table[(int)local_1c] >> 1 ^ uVar1
        ;
      }
    }
  }
  for (local_1c = 0; (int)local_1c < len; local_1c = local_1c + 1) {
    j = (uint)j >> 8 ^ stbiw__crc32::crc_table[(uint)buffer[(int)local_1c] ^ j & 0xffU];
  }
  return j ^ 0xffffffff;
}

Assistant:

unsigned int stbiw__crc32(unsigned char *buffer, int len)
{
   static unsigned int crc_table[256];
   unsigned int crc = ~0u;
   int i,j;
   if (crc_table[1] == 0)
      for(i=0; i < 256; i++)
         for (crc_table[i]=i, j=0; j < 8; ++j)
            crc_table[i] = (crc_table[i] >> 1) ^ (crc_table[i] & 1 ? 0xedb88320 : 0);
   for (i=0; i < len; ++i)
      crc = (crc >> 8) ^ crc_table[buffer[i] ^ (crc & 0xff)];
   return ~crc;
}